

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

SRes LzmaEnc_CodeOneBlock
               (CLzmaEnc *p,Bool_conflict useLimits,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  UInt16 *pUVar5;
  CRangeEnc *pCVar6;
  CRangeEnc *p_00;
  UInt16 (*paUVar7) [64];
  UInt32 UVar8;
  uint uVar9;
  UInt32 UVar10;
  UInt32 UVar11;
  SRes SVar12;
  Byte *pBVar13;
  undefined8 uVar14;
  COptimal *pCVar15;
  uint uVar16;
  UInt32 *pUVar17;
  int *piVar18;
  COptimal *pCVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  UInt32 m;
  Byte *pBVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  Byte *pBVar30;
  uint uVar31;
  long lVar32;
  UInt32 (*paUVar33) [272];
  uint uVar34;
  ulong uVar35;
  UInt32 m_2;
  uint uVar36;
  UInt32 m_1;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  bool bVar42;
  int iVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar55;
  int iVar57;
  undefined1 auVar56 [16];
  int iVar59;
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  UInt32 numPairs;
  UInt32 numPairs_1;
  UInt32 repLens [4];
  UInt32 local_24c;
  ulong local_248;
  ulong local_240;
  UInt32 *local_238;
  ulong local_230;
  COptimal *local_228;
  UInt32 local_21c;
  Byte *local_218;
  ulong local_210;
  uint local_204;
  Byte *local_200;
  ulong local_1f8;
  uint local_1f0;
  uint local_1ec;
  ulong local_1e8;
  long local_1e0;
  ulong local_1d8;
  CRangeEnc *local_1d0;
  ulong local_1c8;
  UInt16 (*local_1c0) [16];
  uint local_1b8 [3];
  UInt32 UStack_1ac;
  UInt16 *local_1a8;
  ulong local_1a0;
  uint local_198;
  uint local_194;
  UInt32 (*local_190) [272];
  UInt16 (*local_188) [16];
  ulong local_180;
  COptimal *local_178;
  UInt32 *local_170;
  ulong local_168;
  UInt16 *local_160;
  ulong local_158;
  ulong local_150;
  int local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  UInt32 *local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  UInt32 (*local_118) [272];
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  uint local_e8;
  uint local_e4;
  UInt32 local_e0;
  Bool_conflict local_dc;
  uint local_d8 [6];
  UInt16 *local_c0;
  UInt16 *local_b8;
  UInt32 (*local_b0) [128];
  UInt32 (*local_a8) [64];
  UInt32 *local_a0;
  UInt32 *local_98;
  UInt16 *local_90;
  UInt16 *local_88;
  UInt16 *local_80;
  ulong local_78;
  undefined8 local_70;
  CLenPriceEnc *local_68;
  UInt16 *local_60;
  UInt16 (*local_58) [64];
  CLenPriceEnc *local_50;
  Byte *local_48;
  ulong local_40;
  Byte *local_38;
  undefined4 extraout_var;
  
  local_e0 = maxUnpackSize;
  local_dc = useLimits;
  if (p->needInit != 0) {
    (*(p->matchFinder).Init)(p->matchFinderObj);
    p->needInit = 0;
  }
  if (p->finished != 0 || p->result != 0) {
    return p->result;
  }
  if ((p->rc).res == 0) {
    if ((p->matchFinderBase).result == 0) {
      local_100 = p->nowPos64;
      uVar39 = local_100 & 0xffffffff;
      if (local_100 == 0) {
        UVar8 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
        if (UVar8 == 0) {
          UVar8 = (UInt32)local_100;
          goto LAB_00113481;
        }
        ReadMatchDistances(p,local_1b8);
        RangeEnc_EncodeBit(&p->rc,p->isMatch[p->state],0);
        p->state = kLiteralNextStates[p->state];
        pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
        pUVar5 = p->litProbs;
        uVar37 = pBVar13[-(ulong)p->additionalOffset] | 0x100;
        do {
          RangeEnc_EncodeBit(&p->rc,(UInt16 *)((ulong)(uVar37 >> 7 & 0xfffffffe) + (long)pUVar5),
                             uVar37 >> 7 & 1);
          bVar42 = uVar37 < 0x8000;
          uVar37 = uVar37 * 2;
        } while (bVar42);
        p->additionalOffset = p->additionalOffset - 1;
        uVar39 = 1;
      }
      UVar8 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
      if (UVar8 != 0) {
        local_98 = &p->numPairs;
        local_170 = p->reps;
        local_228 = p->opt;
        local_238 = p->ProbPrices;
        local_1c0 = p->isMatch;
        local_160 = p->isRep;
        local_1a8 = p->isRepG0;
        local_188 = p->isRep0Long;
        local_138 = p->opt[0].backs;
        local_118 = (p->repLenEnc).prices;
        local_190 = (p->lenEnc).prices;
        local_a8 = p->posSlotPrices;
        local_b0 = p->distancesPrices;
        local_48 = (Byte *)(ulong)maxPackSize;
        local_1d0 = &p->rc;
        local_50 = &p->lenEnc;
        local_58 = p->posSlotEncoder;
        local_88 = p->posAlignEncoder;
        local_90 = p->posEncoders;
        local_60 = p->isRepG1;
        local_80 = p->isRepG2;
        local_68 = &p->repLenEnc;
        local_a0 = p->ProbPrices + 0x7d;
        local_c0 = (p->repLenEnc).p.high + 0xfe;
        local_178 = p->opt + 4;
        do {
          do {
            local_1f8 = uVar39;
            if (p->fastMode == 0) {
              uVar37 = p->optimumCurrentIndex;
              if (p->optimumEndIndex == uVar37) {
                p->optimumEndIndex = 0;
                p->optimumCurrentIndex = 0;
                if (p->additionalOffset == 0) {
                  UVar8 = ReadMatchDistances(p,&local_194);
                }
                else {
                  UVar8 = p->longestMatchLength;
                  local_194 = p->numPairs;
                }
                uVar37 = p->numAvail;
                uVar35 = 0xffffffff;
                if (uVar37 < 2) {
LAB_00111017:
                  uVar41 = 1;
                }
                else {
                  uVar9 = 0x111;
                  if (uVar37 < 0x111) {
                    uVar9 = uVar37;
                  }
                  pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                  uVar39 = local_1f8;
                  bVar1 = pBVar13[-1];
                  if (uVar9 < 4) {
                    uVar9 = 3;
                  }
                  uVar25 = *(ulong *)local_170;
                  local_1b8[0] = (uint)uVar25;
                  local_1b8[1] = (uint)(uVar25 >> 0x20);
                  local_1b8[2] = (uint)*(ulong *)(local_170 + 2);
                  UStack_1ac = (UInt32)(*(ulong *)(local_170 + 2) >> 0x20);
                  uVar41 = 0;
                  uVar35 = 0;
                  do {
                    if ((bVar1 == pBVar13[-2 - (ulong)local_170[uVar41]]) &&
                       (lVar27 = -(ulong)local_170[uVar41], *pBVar13 == pBVar13[lVar27 + -1])) {
                      uVar22 = 2;
                      if (uVar37 != 2) {
                        uVar28 = 2;
                        do {
                          uVar22 = uVar28;
                          if (pBVar13[uVar28 - 1] != pBVar13[uVar28 + lVar27 + -2]) break;
                          uVar28 = uVar28 + 1;
                          uVar22 = (ulong)uVar9;
                        } while (uVar9 != uVar28);
                      }
                      local_d8[uVar41] = (uint)uVar22;
                      if (local_d8[uVar35] < (uint)uVar22) {
                        uVar35 = uVar41 & 0xffffffff;
                      }
                    }
                    else {
                      local_d8[uVar41] = 0;
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != 4);
                  uVar37 = local_d8[uVar35];
                  uVar41 = (ulong)uVar37;
                  if (uVar37 < p->numFastBytes) {
                    if (UVar8 < p->numFastBytes) {
                      bVar2 = pBVar13[~(ulong)(local_1b8[0] + 1)];
                      if (((uVar37 < 2) && (UVar8 < 2)) && (bVar1 != bVar2)) {
                        local_24c = 0xffffffff;
                        uVar35 = 0xffffffff;
                        goto LAB_00111897;
                      }
                      uVar39 = (ulong)p->state;
                      p->opt[0].state = p->state;
                      bVar3 = (byte)p->lc;
                      uVar37 = p->pbMask & (uint)local_1f8;
                      uVar22 = (ulong)uVar37;
                      uVar9 = (uint)(local_1c0[uVar39][uVar22] >> 4);
                      UVar11 = p->ProbPrices[uVar9];
                      local_21c = CONCAT31(local_21c._1_3_,bVar2);
                      local_240 = uVar41;
                      local_230 = uVar39;
                      local_130 = uVar25 & 0xffffffff;
                      if (uVar39 < 7) {
                        UVar10 = 0;
                        uVar40 = bVar1 + 0x100;
                        do {
                          UVar10 = UVar10 + local_238[((uint)(int)(char)uVar40 >> 7 & 0x7f0 ^
                                                      (uint)(p->litProbs +
                                                            ((uint)(pBVar13[-2] >>
                                                                   (8 - bVar3 & 0x1f)) +
                                                            ((p->lpMask & (uint)local_1f8) <<
                                                            (bVar3 & 0x1f))) * 0x300)[uVar40 >> 8])
                                                      >> 4];
                          bVar42 = uVar40 < 0x8000;
                          uVar40 = uVar40 * 2;
                        } while (bVar42);
                      }
                      else {
                        UVar10 = LitEnc_GetPriceMatched
                                           (p->litProbs +
                                            ((uint)(pBVar13[-2] >> (8 - bVar3 & 0x1f)) +
                                            ((p->lpMask & (uint)local_1f8) << (bVar3 & 0x1f))) *
                                            0x300,(uint)bVar1,(uint)bVar2,local_238);
                      }
                      pUVar5 = local_c0;
                      auVar62 = _DAT_00116440;
                      auVar61 = _DAT_00116430;
                      auVar60 = _DAT_00116420;
                      uVar40 = UVar10 + UVar11;
                      p->opt[1].price = uVar40;
                      p->opt[1].backPrev = 0xffffffff;
                      p->opt[1].prev1IsChar = 0;
                      UVar11 = p->ProbPrices[uVar9 ^ 0x7f];
                      uVar9 = (uint)(p->isRep[local_230] >> 4);
                      iVar26 = *(int *)((long)p->ProbPrices + (ulong)((uVar9 ^ 0x7f) << 2)) + UVar11
                      ;
                      uVar35 = 0xffffffff;
                      if ((bVar1 == (byte)local_21c) &&
                         (uVar36 = local_238[local_1a8[local_230] >> 4] + iVar26 +
                                   local_238[local_188[uVar39][uVar22] >> 4], uVar36 < uVar40)) {
                        p->opt[1].price = uVar36;
                        p->opt[1].backPrev = 0;
                        uVar35 = 0;
                      }
                      uVar39 = local_240 & 0xffffffff;
                      if ((uint)local_240 < UVar8) {
                        uVar39 = (ulong)UVar8;
                      }
                      if ((uint)uVar39 < 2) {
                        uVar41 = 1;
                        uVar39 = local_1f8;
                        local_24c = (uint)uVar35;
                      }
                      else {
                        local_210 = CONCAT44(local_210._4_4_,uVar9);
                        p->opt[1].posPrev = 0;
                        uVar41 = *(ulong *)(local_170 + 2);
                        *(ulong *)local_138 = *(ulong *)local_170;
                        *(ulong *)(local_138 + 2) = uVar41;
                        uVar41 = (ulong)((uint)uVar39 - 1);
                        lVar27 = uVar41 - 1;
                        auVar58._8_4_ = (int)lVar27;
                        auVar58._0_8_ = lVar27;
                        auVar58._12_4_ = (int)((ulong)lVar27 >> 0x20);
                        pCVar19 = local_228 + uVar39;
                        uVar35 = 0;
                        do {
                          auVar48._8_4_ = (int)uVar35;
                          auVar48._0_8_ = uVar35;
                          auVar48._12_4_ = (int)(uVar35 >> 0x20);
                          auVar56 = (auVar48 | auVar61) ^ auVar62;
                          iVar38 = SUB164(auVar58 ^ auVar62,0);
                          bVar42 = iVar38 < auVar56._0_4_;
                          iVar47 = SUB164(auVar58 ^ auVar62,4);
                          iVar54 = auVar56._4_4_;
                          if ((bool)(~(iVar47 < iVar54 || iVar54 == iVar47 && bVar42) & 1)) {
                            pCVar19->price = 0x40000000;
                          }
                          if (iVar47 >= iVar54 && (iVar54 != iVar47 || !bVar42)) {
                            pCVar19[-1].price = 0x40000000;
                          }
                          auVar48 = (auVar48 | auVar60) ^ auVar62;
                          iVar54 = auVar48._4_4_;
                          if (iVar54 <= iVar47 && (iVar54 != iVar47 || auVar48._0_4_ <= iVar38)) {
                            pCVar19[-2].price = 0x40000000;
                            pCVar19[-3].price = 0x40000000;
                          }
                          uVar35 = uVar35 + 4;
                          pCVar19 = pCVar19 + -4;
                        } while ((uVar41 + 3 & 0xfffffffffffffffc) != uVar35);
                        local_248 = uVar22 * 0x440;
                        lVar27 = 0;
                        paUVar33 = local_190;
                        pCVar19 = local_228;
                        local_240 = uVar39;
                        local_21c = UVar11;
                        do {
                          uVar39 = (ulong)local_d8[lVar27];
                          if (1 < uVar39) {
                            UVar11 = GetPureRepPrice(p,(UInt32)lVar27,(UInt32)local_230,uVar37);
                            pCVar15 = local_228 + uVar39;
                            do {
                              uVar39 = uVar39 - 1;
                              uVar9 = *(int *)(pUVar5 + uVar22 * 0x220 + uVar39 * 2 + 2) +
                                      UVar11 + iVar26;
                              if (uVar9 < pCVar15->price) {
                                pCVar15->price = uVar9;
                                pCVar15->posPrev = 0;
                                pCVar15->backPrev = (UInt32)lVar27;
                                pCVar15->prev1IsChar = 0;
                              }
                              pCVar15 = pCVar15 + -1;
                              paUVar33 = local_190;
                              pCVar19 = local_228;
                            } while ((uVar39 & 0xfffffffe) != 0);
                          }
                          lVar27 = lVar27 + 1;
                        } while (lVar27 != 4);
                        uVar39 = (ulong)(local_d8[0] + 1);
                        if (local_d8[0] < 2) {
                          uVar39 = 2;
                        }
                        if ((uint)uVar39 <= UVar8) {
                          UVar8 = local_238[local_210 & 0xffff];
                          uVar41 = 0xfffffffe;
                          do {
                            uVar41 = (ulong)((int)uVar41 + 2);
                          } while (p->matches[uVar41] < (uint)uVar39);
                          while( true ) {
                            uVar37 = p->matches[(int)uVar41 + 1];
                            uVar9 = (uint)uVar39;
                            uVar40 = 3;
                            if (uVar9 < 5) {
                              uVar40 = uVar9 - 2;
                            }
                            if ((ulong)uVar37 < 0x80) {
                              UVar11 = local_b0[uVar40][uVar37];
                            }
                            else {
                              iVar26 = 6;
                              if (0x7ffff < uVar37) {
                                iVar26 = 0x12;
                              }
                              UVar11 = local_a8[uVar40]
                                       [(uint)p->g_FastPos[uVar37 >> (sbyte)iVar26] + iVar26 * 2] +
                                       p->alignPrices[uVar37 & 0xf];
                              paUVar33 = local_190;
                            }
                            uVar40 = *(int *)((long)*paUVar33 + (ulong)(uVar9 - 2) * 4 + local_248)
                                     + local_21c + UVar8 + UVar11;
                            if (uVar40 < pCVar19[uVar39].price) {
                              pCVar15 = pCVar19 + uVar39;
                              pCVar15->price = uVar40;
                              pCVar15->posPrev = 0;
                              pCVar15->backPrev = uVar37 + 4;
                              pCVar15->prev1IsChar = 0;
                            }
                            uVar37 = (int)uVar41 + 2;
                            if ((uVar9 == p->matches[uVar41]) && (uVar37 == local_194)) break;
                            if (uVar9 == p->matches[uVar41]) {
                              uVar41 = (ulong)uVar37;
                            }
                            uVar39 = (ulong)(uVar9 + 1);
                          }
                        }
                        local_108 = (ulong)((int)local_1f8 + 1);
                        local_1e8 = 0xffe;
                        lVar27 = 1;
                        uVar39 = 0;
                        local_120 = local_1f8 & 0xffffffff;
                        uVar41 = local_240;
                        do {
                          local_230 = local_120;
                          uVar35 = (ulong)((int)uVar39 + 1);
                          local_1e0 = lVar27;
                          local_1d8 = uVar39;
                          UVar8 = ReadMatchDistances(p,&local_198);
                          uVar14 = CONCAT44(extraout_var,UVar8);
                          if (p->numFastBytes <= UVar8) {
                            p->numPairs = local_198;
                            p->longestMatchLength = UVar8;
                            uVar41 = uVar35;
                            break;
                          }
                          pCVar19 = local_228 + uVar35;
                          uVar37 = local_228[uVar35].posPrev;
                          uVar39 = (ulong)uVar37;
                          local_248 = uVar35;
                          local_240 = uVar41;
                          local_70 = uVar14;
                          if (local_228[uVar35].prev1IsChar == 0) {
                            uVar9 = local_228[uVar39].state;
                            uVar41 = (ulong)uVar9;
                            if (uVar37 == (uint)local_1d8) goto LAB_00111dc7;
LAB_00111e01:
                            uVar40 = pCVar19->backPrev;
                            if (3 < uVar40) {
                              uVar37 = kMatchNextStates[uVar9];
                              goto LAB_00111e90;
                            }
                            uVar37 = kRepNextStates[uVar9];
LAB_00111e16:
                            local_1b8[0] = local_228[uVar39].backs[uVar40];
                            uVar41 = (ulong)local_1b8[0];
                            if (uVar40 == 0) {
                              iVar26 = 1;
                            }
                            else {
                              memcpy(local_1b8 + 1,local_138 + uVar39 * 0xc,(ulong)uVar40 * 4);
                              if (2 < uVar40) goto LAB_00111f0c;
                              iVar26 = uVar40 + 1;
                            }
                            memcpy((void *)((long)local_1b8 + (ulong)(uint)(iVar26 << 2)),
                                   (void *)((long)local_138 +
                                           (ulong)(uint)(iVar26 << 2) + uVar39 * 0x30),
                                   (ulong)(uVar40 * -4 + 0xc));
                            uVar41 = (ulong)local_1b8[0];
                          }
                          else {
                            uVar37 = uVar37 - 1;
                            if (pCVar19->prev2 == 0) {
                              uVar39 = (ulong)uVar37;
                              uVar9 = kLiteralNextStates[local_228[uVar39].state];
                              uVar41 = (ulong)uVar9;
                              if (uVar37 != (uint)local_1d8) goto LAB_00111e01;
                            }
                            else {
                              uVar39 = (ulong)pCVar19->posPrev2;
                              uVar40 = pCVar19->backPrev2;
                              piVar18 = kMatchNextStates;
                              if (uVar40 < 4) {
                                piVar18 = kRepNextStates;
                              }
                              uVar41 = (ulong)(uint)kLiteralNextStates
                                                    [(uint)piVar18[local_228[uVar39].state]];
                              if (uVar37 != (uint)local_1d8) {
                                uVar37 = kRepNextStates[uVar41];
                                if (uVar40 < 4) goto LAB_00111e16;
LAB_00111e90:
                                local_1b8[0] = uVar40 - 4;
                                UStack_1ac = local_138[uVar39 * 0xc + 2];
                                local_1b8[1] = (uint)*(undefined8 *)(local_138 + uVar39 * 0xc);
                                local_1b8[2] = (uint)((ulong)*(undefined8 *)
                                                              (local_138 + uVar39 * 0xc) >> 0x20);
                                uVar41 = (ulong)local_1b8[0];
                                goto LAB_00111f0c;
                              }
                            }
LAB_00111dc7:
                            if (pCVar19->backPrev == 0) {
                              piVar18 = kShortRepNextStates;
                            }
                            else {
                              piVar18 = kLiteralNextStates;
                            }
                            uVar37 = piVar18[uVar41];
                            uVar41 = local_130;
                          }
LAB_00111f0c:
                          uVar9 = (int)local_230 + 1;
                          pCVar19->state = uVar37;
                          pCVar19->backs[0] = (UInt32)uVar41;
                          *(ulong *)(pCVar19->backs + 1) = CONCAT44(local_1b8[2],local_1b8[1]);
                          pCVar19->backs[3] = UStack_1ac;
                          UVar8 = pCVar19->price;
                          local_218 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                          pUVar17 = local_238;
                          local_200 = local_218 + -1;
                          local_204 = p->pbMask;
                          local_1a0 = (ulong)(local_204 & uVar9);
                          uVar39 = (ulong)uVar37;
                          uVar40 = (uint)(local_1c0[uVar39][local_1a0] >> 4);
                          local_140 = p->lc;
                          local_144 = p->lpMask;
                          UVar11 = p->ProbPrices[uVar40];
                          local_148 = 8 - local_140;
                          local_b8 = p->litProbs;
                          pUVar5 = p->litProbs +
                                   ((uint)(local_218[-2] >> ((byte)local_148 & 0x1f)) +
                                   ((local_144 & uVar9) << ((byte)local_140 & 0x1f))) * 0x300;
                          bVar1 = local_218[-1];
                          local_210 = CONCAT44(local_210._4_4_,
                                               (uint)local_200[-(ulong)((UInt32)uVar41 + 1)]);
                          local_180 = uVar39;
                          local_130 = uVar41;
                          local_120 = (ulong)uVar9;
                          if (uVar37 < 7) {
                            UVar10 = 0;
                            uVar37 = bVar1 + 0x100;
                            do {
                              UVar10 = UVar10 + local_238[((uint)(int)(char)uVar37 >> 7 & 0x7f0 ^
                                                          (uint)pUVar5[uVar37 >> 8]) >> 4];
                              bVar42 = uVar37 < 0x8000;
                              uVar37 = uVar37 * 2;
                            } while (bVar42);
                          }
                          else {
                            UVar10 = LitEnc_GetPriceMatched
                                               (pUVar5,(uint)bVar1,
                                                (uint)local_200[-(ulong)((UInt32)uVar41 + 1)],
                                                local_238);
                          }
                          pUVar5 = local_c0;
                          uVar35 = local_1a0;
                          auVar62 = _DAT_00116440;
                          auVar61 = _DAT_00116430;
                          auVar60 = _DAT_00116420;
                          uVar34 = UVar11 + UVar8 + UVar10;
                          uVar9 = (int)local_1d8 + 2;
                          pCVar19 = local_228 + uVar9;
                          bVar42 = uVar34 < local_228[uVar9].price;
                          uVar36 = (uint)local_248;
                          uVar37 = local_228[uVar9].price;
                          if (bVar42) {
                            pCVar19->price = uVar34;
                            pCVar19->posPrev = uVar36;
                            pCVar19->backPrev = 0xffffffff;
                            pCVar19->prev1IsChar = 0;
                            uVar37 = uVar34;
                          }
                          local_21c = UVar8 + pUVar17[uVar40 ^ 0x7f];
                          uVar4 = local_160[local_180];
                          local_1ec = *(int *)((long)pUVar17 + (ulong)((uVar4 >> 4 ^ 0x7f) << 2)) +
                                      local_21c;
                          if (((byte)local_210 == bVar1) &&
                             (((uVar36 <= pCVar19->posPrev || (pCVar19->backPrev != 0)) &&
                              (uVar40 = pUVar17[local_1a8[local_180] >> 4] + local_1ec +
                                        pUVar17[local_188[uVar39][local_1a0] >> 4], uVar40 <= uVar37
                              )))) {
                            pCVar19->price = uVar40;
                            pCVar19->posPrev = uVar36;
                            pCVar19->backPrev = 0;
                            pCVar19->prev1IsChar = 0;
                            bVar42 = true;
                          }
                          uVar25 = local_1e8 & 0xffffffff;
                          uVar37 = p->numAvail;
                          local_128 = (ulong)uVar37;
                          uVar40 = 0xffe - (int)local_1d8;
                          if (uVar37 <= uVar40) {
                            uVar40 = uVar37;
                          }
                          uVar39 = local_248;
                          lVar27 = local_1e0;
                          uVar41 = local_240;
                          if (1 < uVar40) {
                            uVar21 = p->numFastBytes;
                            local_158 = (ulong)uVar21;
                            local_1f0 = uVar21;
                            if (uVar40 < uVar21) {
                              local_1f0 = uVar40;
                            }
                            local_e4 = (uint)local_1e8;
                            if (!bVar42 && (byte)local_210 != bVar1) {
                              uVar16 = uVar21 + 1;
                              uVar20 = uVar40;
                              if (uVar16 < uVar40) {
                                uVar20 = uVar16;
                              }
                              if (1 < uVar20) {
                                uVar20 = local_e4;
                                if (uVar37 < local_e4) {
                                  uVar20 = uVar37;
                                }
                                if (uVar16 <= uVar20) {
                                  uVar20 = uVar16;
                                }
                                uVar22 = uVar25;
                                if (local_128 < uVar25) {
                                  uVar22 = local_128;
                                }
                                if (uVar16 <= uVar22) {
                                  uVar22 = (ulong)uVar16;
                                }
                                uVar28 = 1;
                                do {
                                  uVar23 = uVar28;
                                  if (local_218[uVar28 - 1] !=
                                      local_218[uVar28 + (-2 - (local_130 & 0xffffffff))]) break;
                                  uVar28 = uVar28 + 1;
                                  uVar23 = (ulong)uVar20;
                                } while (uVar22 != uVar28);
                                iVar26 = (int)uVar23;
                                if (1 < iVar26 - 1U) {
                                  local_210 = CONCAT44(local_210._4_4_,uVar34);
                                  uVar20 = kLiteralNextStates[local_180];
                                  uVar31 = (int)local_230 + 2U & local_204;
                                  iVar38 = *(int *)((long)local_238 +
                                                   (ulong)(local_1c0[uVar20][uVar31] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  iVar47 = *(int *)((long)local_238 +
                                                   (ulong)(local_160[uVar20] >> 2 & 0xfffffffc ^
                                                          0x1fc));
                                  uVar16 = (iVar26 - 1U) + uVar9;
                                  if ((uint)local_240 < uVar16) {
                                    uVar41 = (ulong)(uVar36 + iVar26);
                                    lVar32 = uVar41 - (local_240 & 0xffffffff);
                                    lVar29 = lVar32 + -1;
                                    auVar56._8_4_ = (int)lVar29;
                                    auVar56._0_8_ = lVar29;
                                    auVar56._12_4_ = (int)((ulong)lVar29 >> 0x20);
                                    pCVar19 = local_178 + (local_240 & 0xffffffff);
                                    uVar22 = 0;
                                    do {
                                      auVar49._8_4_ = (int)uVar22;
                                      auVar49._0_8_ = uVar22;
                                      auVar49._12_4_ = (int)(uVar22 >> 0x20);
                                      auVar58 = (auVar49 | auVar61) ^ auVar62;
                                      iVar54 = SUB164(auVar56 ^ auVar62,0);
                                      bVar42 = iVar54 < auVar58._0_4_;
                                      iVar55 = SUB164(auVar56 ^ auVar62,4);
                                      iVar57 = auVar58._4_4_;
                                      if ((bool)(~(iVar55 < iVar57 || iVar57 == iVar55 && bVar42) &
                                                1)) {
                                        pCVar19[-3].price = 0x40000000;
                                      }
                                      if (iVar55 >= iVar57 && (iVar57 != iVar55 || !bVar42)) {
                                        pCVar19[-2].price = 0x40000000;
                                      }
                                      auVar58 = (auVar49 | auVar60) ^ auVar62;
                                      iVar57 = auVar58._4_4_;
                                      if (iVar57 <= iVar55 &&
                                          (iVar57 != iVar55 || auVar58._0_4_ <= iVar54)) {
                                        pCVar19[-1].price = 0x40000000;
                                        pCVar19->price = 0x40000000;
                                      }
                                      uVar22 = uVar22 + 4;
                                      pCVar19 = pCVar19 + 4;
                                    } while ((lVar32 + 3U & 0xfffffffffffffffc) != uVar22);
                                  }
                                  uVar36 = iVar38 + uVar34 + iVar47 + local_118[uVar31][iVar26 - 3]
                                           + local_238[local_1a8[uVar20] >> 4] +
                                           *(int *)((long)local_238 +
                                                   (ulong)(local_188[uVar20][uVar31] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  if (uVar36 < local_228[uVar16].price) {
                                    pCVar19 = local_228 + uVar16;
                                    pCVar19->price = uVar36;
                                    pCVar19->posPrev = uVar9;
                                    pCVar19->backPrev = 0;
                                    pCVar19->prev1IsChar = 1;
                                    pCVar19->prev2 = 0;
                                  }
                                }
                              }
                            }
                            if (uVar37 < uVar21) {
                              uVar21 = uVar37;
                            }
                            local_78 = (ulong)uVar21;
                            if (local_e4 <= uVar21) {
                              local_78 = uVar25;
                            }
                            if (uVar37 < local_e4) {
                              local_e4 = uVar37;
                            }
                            local_f0 = local_128;
                            if (local_158 < local_128) {
                              local_f0 = local_158;
                            }
                            local_38 = local_218 + -2;
                            if (uVar25 <= local_f0) {
                              local_f0 = uVar25;
                            }
                            local_230 = local_1a0 * 0x440;
                            uVar22 = 2;
                            lVar29 = 0;
                            pBVar13 = local_218;
                            pBVar30 = local_200;
                            pCVar19 = local_228;
                            local_1e8 = uVar25;
                            local_13c = uVar40;
                            local_e8 = (uint)(uVar4 >> 4);
                            do {
                              pBVar24 = pBVar30 + -(ulong)local_1b8[lVar29];
                              if ((*pBVar30 == pBVar24[-1]) && (*pBVar13 == *pBVar24)) {
                                uVar25 = 2;
                                if (2 < local_1f0) {
                                  uVar28 = 2;
                                  do {
                                    uVar25 = uVar28;
                                    if (pBVar13[uVar28 - 1] !=
                                        pBVar13[uVar28 + (-2 - (ulong)local_1b8[lVar29])]) break;
                                    uVar28 = uVar28 + 1;
                                    uVar25 = local_78;
                                  } while (local_f0 != uVar28);
                                }
                                iVar26 = (int)uVar25;
                                uVar9 = iVar26 + (UInt32)uVar39;
                                local_150 = (ulong)uVar9;
                                uVar37 = (uint)uVar41;
                                if ((uint)uVar41 < uVar9) {
                                  uVar28 = uVar41 & 0xffffffff;
                                  lVar27 = ~uVar28 + (ulong)uVar9;
                                  auVar43._8_4_ = (int)lVar27;
                                  auVar43._0_8_ = lVar27;
                                  auVar43._12_4_ = (int)((ulong)lVar27 >> 0x20);
                                  pCVar19 = local_178 + uVar28;
                                  uVar23 = 0;
                                  do {
                                    auVar50._8_4_ = (int)uVar23;
                                    auVar50._0_8_ = uVar23;
                                    auVar50._12_4_ = (int)(uVar23 >> 0x20);
                                    auVar58 = (auVar50 | auVar61) ^ auVar62;
                                    iVar38 = SUB164(auVar43 ^ auVar62,0);
                                    bVar42 = iVar38 < auVar58._0_4_;
                                    iVar47 = SUB164(auVar43 ^ auVar62,4);
                                    iVar54 = auVar58._4_4_;
                                    if ((bool)(~(iVar47 < iVar54 || iVar54 == iVar47 && bVar42) & 1)
                                       ) {
                                      pCVar19[-3].price = 0x40000000;
                                    }
                                    if (iVar47 >= iVar54 && (iVar54 != iVar47 || !bVar42)) {
                                      pCVar19[-2].price = 0x40000000;
                                    }
                                    auVar58 = (auVar50 | auVar60) ^ auVar62;
                                    iVar54 = auVar58._4_4_;
                                    if (iVar54 <= iVar47 &&
                                        (iVar54 != iVar47 || auVar58._0_4_ <= iVar38)) {
                                      pCVar19[-1].price = 0x40000000;
                                      pCVar19->price = 0x40000000;
                                    }
                                    uVar23 = uVar23 + 4;
                                    pCVar19 = pCVar19 + 4;
                                    uVar37 = uVar9;
                                  } while (((local_150 - uVar28) + 3 & 0xfffffffffffffffc) != uVar23
                                          );
                                }
                                local_210 = CONCAT44(local_210._4_4_,uVar37);
                                UVar11 = (UInt32)lVar29;
                                local_240 = uVar41;
                                local_1c8 = uVar22;
                                UVar8 = GetPureRepPrice(p,UVar11,(UInt32)local_180,(UInt32)local_1a0
                                                       );
                                pUVar17 = local_238;
                                iVar38 = UVar8 + local_1ec;
                                uVar25 = uVar25 & 0xffffffff;
                                uVar41 = uVar25;
                                do {
                                  uVar37 = *(int *)(pUVar5 + uVar35 * 0x220 + uVar41 * 2) + iVar38;
                                  uVar9 = (int)local_1e0 + (int)uVar41;
                                  if (uVar37 < local_228[uVar9].price) {
                                    pCVar19 = local_228 + uVar9;
                                    pCVar19->price = uVar37;
                                    pCVar19->posPrev = (UInt32)uVar39;
                                    pCVar19->backPrev = UVar11;
                                    pCVar19->prev1IsChar = 0;
                                  }
                                  uVar41 = uVar41 - 1;
                                } while ((uVar41 & 0xfffffffe) != 0);
                                uVar37 = iVar26 + 1;
                                local_1c8 = local_1c8 & 0xffffffff;
                                if (lVar29 == 0) {
                                  local_1c8 = (ulong)uVar37;
                                }
                                uVar40 = (int)local_158 + iVar26 + 1;
                                uVar9 = local_13c;
                                if (uVar40 < local_13c) {
                                  uVar9 = uVar40;
                                }
                                uVar39 = (ulong)uVar37;
                                if (uVar37 < uVar9) {
                                  uVar9 = uVar40;
                                  if (local_e4 < uVar40) {
                                    uVar9 = local_e4;
                                  }
                                  uVar41 = local_1e8;
                                  if (local_128 < local_1e8) {
                                    uVar41 = local_128;
                                  }
                                  uVar22 = (ulong)uVar37;
                                  if (uVar40 <= uVar41) {
                                    uVar41 = (ulong)uVar40;
                                  }
                                  do {
                                    uVar39 = uVar22;
                                    if (local_200[uVar22] != pBVar24[uVar22 - 1]) break;
                                    uVar22 = uVar22 + 1;
                                    uVar39 = (ulong)uVar9;
                                  } while (uVar41 != uVar22);
                                }
                                uVar37 = (int)uVar39 - uVar37;
                                if (uVar37 < 2) {
                                  uVar41 = local_210 & 0xffffffff;
                                  pBVar13 = local_218;
                                  uVar39 = local_248;
                                  uVar22 = local_1c8;
                                  pBVar30 = local_200;
                                  lVar27 = local_1e0;
                                  pCVar19 = local_228;
                                  auVar60 = _DAT_00116420;
                                  auVar61 = _DAT_00116430;
                                  auVar62 = _DAT_00116440;
                                }
                                else {
                                  local_110 = (ulong)(uint)kRepNextStates[local_180];
                                  uVar9 = iVar26 + (int)local_120;
                                  local_168 = CONCAT44(local_168._4_4_,
                                                       *(undefined4 *)
                                                        ((long)*local_118 +
                                                        (ulong)(iVar26 - 2) * 4 + local_230));
                                  local_f8 = CONCAT44(local_f8._4_4_,
                                                      local_238[local_1c0[local_110]
                                                                [uVar9 & local_204] >> 4]);
                                  local_40 = (ulong)uVar37;
                                  UVar8 = LitEnc_GetPriceMatched
                                                    (local_b8 +
                                                     ((uint)(local_200[iVar26 - 1] >>
                                                            ((byte)local_148 & 0x1f)) +
                                                     ((uVar9 & local_144) <<
                                                     ((byte)local_140 & 0x1f))) * 0x300,
                                                     (uint)local_200[uVar25],
                                                     (uint)pBVar24[uVar25 - 1],local_238);
                                  auVar62 = _DAT_00116440;
                                  auVar61 = _DAT_00116430;
                                  auVar60 = _DAT_00116420;
                                  uVar37 = kLiteralNextStates[local_110];
                                  uVar9 = (int)local_120 + iVar26 + 1U & local_204;
                                  iVar47 = *(int *)((long)pUVar17 +
                                                   (ulong)(local_1c0[uVar37][uVar9] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  iVar54 = *(int *)((long)pUVar17 +
                                                   (ulong)(local_160[uVar37] >> 2 & 0xfffffffc ^
                                                          0x1fc));
                                  uVar40 = (int)local_150 + (int)local_40 + 1;
                                  UVar10 = (UInt32)local_248;
                                  if ((uint)local_210 < uVar40) {
                                    local_110 = CONCAT44(local_110._4_4_,iVar47);
                                    uVar41 = (ulong)((int)uVar39 + UVar10);
                                    lVar27 = ~(local_210 & 0xffffffff) + uVar41;
                                    auVar44._8_4_ = (int)lVar27;
                                    auVar44._0_8_ = lVar27;
                                    auVar44._12_4_ = (int)((ulong)lVar27 >> 0x20);
                                    uVar39 = (ulong)(iVar26 + UVar10);
                                    if ((ulong)(iVar26 + UVar10) < (local_240 & 0xffffffff)) {
                                      uVar39 = local_240 & 0xffffffff;
                                    }
                                    pCVar19 = local_178 + uVar39;
                                    uVar25 = 0;
                                    do {
                                      auVar51._8_4_ = (int)uVar25;
                                      auVar51._0_8_ = uVar25;
                                      auVar51._12_4_ = (int)(uVar25 >> 0x20);
                                      auVar58 = (auVar51 | auVar61) ^ auVar62;
                                      iVar26 = SUB164(auVar44 ^ auVar62,0);
                                      bVar42 = iVar26 < auVar58._0_4_;
                                      iVar55 = SUB164(auVar44 ^ auVar62,4);
                                      iVar57 = auVar58._4_4_;
                                      if ((bool)(~(iVar55 < iVar57 || iVar57 == iVar55 && bVar42) &
                                                1)) {
                                        pCVar19[-3].price = 0x40000000;
                                      }
                                      if (iVar55 >= iVar57 && (iVar57 != iVar55 || !bVar42)) {
                                        pCVar19[-2].price = 0x40000000;
                                      }
                                      auVar58 = (auVar51 | auVar60) ^ auVar62;
                                      iVar57 = auVar58._4_4_;
                                      if (iVar57 <= iVar55 &&
                                          (iVar57 != iVar55 || auVar58._0_4_ <= iVar26)) {
                                        pCVar19[-1].price = 0x40000000;
                                        pCVar19->price = 0x40000000;
                                      }
                                      uVar25 = uVar25 + 4;
                                      pCVar19 = pCVar19 + 4;
                                    } while (((uVar41 - uVar39) + 3 & 0xfffffffffffffffc) != uVar25)
                                    ;
                                  }
                                  else {
                                    uVar41 = local_210 & 0xffffffff;
                                  }
                                  uVar37 = (int)local_168 + iVar38 + UVar8 + (int)local_f8 + iVar54
                                           + iVar47 + local_118[uVar9][(int)local_40 - 2] +
                                           local_238[local_1a8[uVar37] >> 4] +
                                           *(int *)((long)local_238 +
                                                   (ulong)(local_188[uVar37][uVar9] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  pBVar13 = local_218;
                                  uVar39 = local_248;
                                  uVar22 = local_1c8;
                                  pBVar30 = local_200;
                                  lVar27 = local_1e0;
                                  pCVar19 = local_228;
                                  if (uVar37 < local_228[uVar40].price) {
                                    pCVar15 = local_228 + uVar40;
                                    pCVar15->price = uVar37;
                                    pCVar15->posPrev = (int)local_150 + 1;
                                    pCVar15->backPrev = 0;
                                    pCVar15->prev1IsChar = 1;
                                    pCVar15->prev2 = 1;
                                    pCVar15->posPrev2 = UVar10;
                                    pCVar15->backPrev2 = UVar11;
                                  }
                                }
                              }
                              lVar29 = lVar29 + 1;
                            } while (lVar29 != 4);
                            uVar37 = (uint)local_70;
                            uVar9 = uVar37;
                            if (local_1f0 < uVar37) {
                              local_198 = 0;
                              do {
                                uVar9 = local_198;
                                local_198 = uVar9 + 2;
                              } while (p->matches[uVar9] < local_1f0);
                              p->matches[uVar9] = local_1f0;
                              uVar9 = local_1f0;
                            }
                            uVar25 = local_1e8;
                            if ((uint)uVar22 <= uVar9) {
                              local_21c = local_21c + local_238[(ushort)local_e8];
                              iVar26 = (int)uVar39;
                              uVar40 = (uint)local_158;
                              if ((uint)uVar41 < uVar9 + iVar26) {
                                uVar39 = uVar41 & 0xffffffff;
                                if ((uint)local_128 <= uVar37) {
                                  uVar37 = (uint)local_128;
                                }
                                if (uVar40 <= uVar37) {
                                  uVar37 = uVar40;
                                }
                                uVar36 = (uint)local_1e8;
                                uVar9 = uVar36;
                                if (uVar37 < uVar36) {
                                  uVar9 = uVar37;
                                }
                                uVar41 = (ulong)(uVar9 + iVar26);
                                lVar27 = ~uVar39 + uVar41;
                                auVar45._8_4_ = (int)lVar27;
                                auVar45._0_8_ = lVar27;
                                auVar45._12_4_ = (int)((ulong)lVar27 >> 0x20);
                                if (uVar36 <= uVar37) {
                                  uVar37 = uVar36;
                                }
                                pCVar15 = local_178 + uVar39;
                                uVar35 = 0;
                                do {
                                  auVar52._8_4_ = (int)uVar35;
                                  auVar52._0_8_ = uVar35;
                                  auVar52._12_4_ = (int)(uVar35 >> 0x20);
                                  auVar58 = (auVar52 | auVar61) ^ auVar62;
                                  iVar38 = SUB164(auVar45 ^ auVar62,0);
                                  bVar42 = iVar38 < auVar58._0_4_;
                                  iVar47 = SUB164(auVar45 ^ auVar62,4);
                                  iVar54 = auVar58._4_4_;
                                  if ((bool)(~(iVar47 < iVar54 || iVar54 == iVar47 && bVar42) & 1))
                                  {
                                    pCVar15[-3].price = 0x40000000;
                                  }
                                  if (iVar47 >= iVar54 && (iVar54 != iVar47 || !bVar42)) {
                                    pCVar15[-2].price = 0x40000000;
                                  }
                                  auVar58 = (auVar52 | auVar60) ^ auVar62;
                                  iVar54 = auVar58._4_4_;
                                  if (iVar54 <= iVar47 &&
                                      (iVar54 != iVar47 || auVar58._0_4_ <= iVar38)) {
                                    pCVar15[-1].price = 0x40000000;
                                    pCVar15->price = 0x40000000;
                                  }
                                  uVar35 = uVar35 + 4;
                                  pCVar15 = pCVar15 + 4;
                                } while ((((uVar37 + iVar26) - uVar39) + 3 & 0xfffffffffffffffc) !=
                                         uVar35);
                              }
                              uVar35 = 0xfffffffe;
                              do {
                                iVar26 = (int)uVar35;
                                uVar35 = (ulong)(iVar26 + 2);
                              } while (p->matches[uVar35] < (uint)uVar22);
                              uVar39 = (ulong)p->matches[iVar26 + 3];
                              iVar38 = 0x12;
                              if (uVar39 < 0x80000) {
                                iVar38 = 6;
                              }
                              uVar37 = (uint)p->g_FastPos[p->matches[iVar26 + 3] >> (sbyte)iVar38] +
                                       iVar38 * 2;
                              local_1f0 = local_198;
                              local_158 = (ulong)(uVar40 + 1);
                              uVar25 = uVar22;
                              paUVar33 = local_190;
                              local_240 = uVar41;
                              do {
                                local_218 = (Byte *)(ulong)uVar37;
                                do {
                                  uVar9 = (uint)uVar25;
                                  uVar37 = (uint)uVar39;
                                  iVar26 = 0;
                                  while( true ) {
                                    uVar40 = uVar9 + iVar26;
                                    uVar41 = (ulong)((uVar9 - 2) + iVar26);
                                    lVar27 = uVar41 * 4;
                                    if (4 < uVar40) {
                                      uVar41 = 3;
                                    }
                                    if (uVar37 < 0x80) {
                                      UVar8 = local_b0[uVar41][uVar39];
                                    }
                                    else {
                                      UVar8 = p->alignPrices[uVar37 & 0xf] +
                                              local_a8[uVar41][(long)local_218];
                                    }
                                    uVar34 = *(int *)((long)*paUVar33 + lVar27 + local_230) +
                                             local_21c + UVar8;
                                    uVar36 = (int)local_1d8 + uVar9 + iVar26 + 1;
                                    if (uVar34 < pCVar19[uVar36].price) {
                                      pCVar15 = pCVar19 + uVar36;
                                      pCVar15->price = uVar34;
                                      pCVar15->posPrev = (UInt32)local_248;
                                      pCVar15->backPrev = uVar37 + 4;
                                      pCVar15->prev1IsChar = 0;
                                    }
                                    if (uVar40 == p->matches[uVar35]) break;
                                    iVar26 = iVar26 + 1;
                                  }
                                  uVar28 = (ulong)((int)uVar22 + iVar26 + 1);
                                  local_1ec = uVar9 + 1 + iVar26;
                                  uVar36 = (int)local_158 + uVar40;
                                  if (local_13c <= uVar36) {
                                    uVar36 = local_13c;
                                  }
                                  uVar41 = (ulong)local_1ec;
                                  if (local_1ec < uVar36) {
                                    uVar41 = uVar28;
                                    do {
                                      if (local_200[uVar41] != local_38[uVar41 - uVar39]) break;
                                      uVar41 = uVar41 + 1;
                                    } while (uVar41 < uVar36);
                                  }
                                  iVar38 = (int)uVar41;
                                  uVar36 = (~uVar9 + iVar38) - iVar26;
                                  local_210 = uVar35;
                                  local_150 = uVar22;
                                  if (1 < uVar36) {
                                    local_f8 = (ulong)(uint)kMatchNextStates[local_180];
                                    uVar21 = uVar40 + (int)local_108;
                                    local_1a0 = (ulong)(uVar21 & local_204);
                                    local_f0 = CONCAT44(local_f0._4_4_,
                                                        local_238[local_1c0[local_f8][local_1a0] >>
                                                                  4]);
                                    local_1c8 = uVar28;
                                    local_168 = (ulong)uVar36;
                                    UVar8 = LitEnc_GetPriceMatched
                                                      (local_b8 +
                                                       ((uint)(local_200[(uVar9 + iVar26) - 1] >>
                                                              ((byte)local_148 & 0x1f)) +
                                                       ((uVar21 & local_144) <<
                                                       ((byte)local_140 & 0x1f))) * 0x300,
                                                       (uint)local_200[uVar40],
                                                       (uint)local_38[uVar40 - uVar39],local_238);
                                    auVar62 = _DAT_00116440;
                                    auVar61 = _DAT_00116430;
                                    auVar60 = _DAT_00116420;
                                    uVar36 = kLiteralNextStates[local_f8];
                                    local_1a0 = (ulong)((int)local_1a0 + 1U & local_204);
                                    iVar47 = *(int *)((long)local_238 +
                                                     (ulong)(local_1c0[uVar36][local_1a0] >> 2 &
                                                             0xfffffffc ^ 0x1fc));
                                    uVar21 = (int)local_1d8 + uVar40 + (int)local_168 + 2;
                                    iVar54 = *(int *)((long)local_238 +
                                                     (ulong)(local_160[uVar36] >> 2 & 0xfffffffc ^
                                                            0x1fc));
                                    if ((uint)local_240 < uVar21) {
                                      local_168 = CONCAT44(local_168._4_4_,UVar8);
                                      uVar39 = local_240 & 0xffffffff;
                                      local_240 = (ulong)(iVar38 + (UInt32)local_248);
                                      lVar29 = local_240 - uVar39;
                                      lVar27 = lVar29 + -1;
                                      auVar46._8_4_ = (int)lVar27;
                                      auVar46._0_8_ = lVar27;
                                      auVar46._12_4_ = (int)((ulong)lVar27 >> 0x20);
                                      pCVar19 = local_178 + uVar39;
                                      uVar39 = 0;
                                      do {
                                        auVar53._8_4_ = (int)uVar39;
                                        auVar53._0_8_ = uVar39;
                                        auVar53._12_4_ = (int)(uVar39 >> 0x20);
                                        auVar58 = (auVar53 | auVar61) ^ auVar62;
                                        iVar55 = SUB164(auVar46 ^ auVar62,0);
                                        bVar42 = iVar55 < auVar58._0_4_;
                                        iVar57 = SUB164(auVar46 ^ auVar62,4);
                                        iVar59 = auVar58._4_4_;
                                        if ((bool)(~(iVar57 < iVar59 || iVar59 == iVar57 && bVar42)
                                                  & 1)) {
                                          pCVar19[-3].price = 0x40000000;
                                        }
                                        if (iVar57 >= iVar59 && (iVar59 != iVar57 || !bVar42)) {
                                          pCVar19[-2].price = 0x40000000;
                                        }
                                        auVar58 = (auVar53 | auVar60) ^ auVar62;
                                        iVar59 = auVar58._4_4_;
                                        if (iVar59 <= iVar57 &&
                                            (iVar59 != iVar57 || auVar58._0_4_ <= iVar55)) {
                                          pCVar19[-1].price = 0x40000000;
                                          pCVar19->price = 0x40000000;
                                        }
                                        uVar39 = uVar39 + 4;
                                        pCVar19 = pCVar19 + 4;
                                      } while ((lVar29 + 3U & 0xfffffffffffffffc) != uVar39);
                                    }
                                    uVar36 = (int)local_f0 + uVar34 + UVar8 + iVar54 + iVar47 +
                                             local_118[local_1a0][((iVar38 - uVar9) - iVar26) - 3] +
                                             local_238[local_1a8[uVar36] >> 4] +
                                             *(int *)((long)local_238 +
                                                     (ulong)(local_188[uVar36][local_1a0] >> 2 &
                                                             0xfffffffc ^ 0x1fc));
                                    uVar28 = local_1c8;
                                    paUVar33 = local_190;
                                    pCVar19 = local_228;
                                    if (uVar36 < local_228[uVar21].price) {
                                      pCVar15 = local_228 + uVar21;
                                      pCVar15->price = uVar36;
                                      pCVar15->posPrev = (int)local_1d8 + uVar40 + 2;
                                      pCVar15->backPrev = 0;
                                      pCVar15->prev1IsChar = 1;
                                      pCVar15->prev2 = 1;
                                      pCVar15->posPrev2 = (UInt32)local_248;
                                      pCVar15->backPrev2 = uVar37 + 4;
                                    }
                                  }
                                  uVar37 = (int)local_210 + 2;
                                  uVar35 = (ulong)uVar37;
                                  uVar39 = local_248;
                                  lVar27 = local_1e0;
                                  uVar41 = local_240;
                                  uVar25 = local_1e8;
                                  if (uVar37 == local_1f0) goto LAB_001132f9;
                                  uVar37 = p->matches[(int)local_210 + 3];
                                  uVar39 = (ulong)uVar37;
                                  uVar25 = (ulong)local_1ec;
                                  uVar22 = uVar28;
                                } while (uVar39 < 0x80);
                                iVar38 = 0x12;
                                if (uVar37 < 0x80000) {
                                  iVar38 = 6;
                                }
                                uVar37 = (uint)p->g_FastPos[uVar37 >> (sbyte)iVar38] + iVar38 * 2;
                                uVar22 = (ulong)((int)local_150 + iVar26 + 1);
                                uVar25 = (ulong)(uVar9 + iVar26 + 1);
                              } while( true );
                            }
                          }
LAB_001132f9:
                          local_1e8 = uVar25;
                          lVar27 = lVar27 + 1;
                          local_1e8 = (ulong)((int)local_1e8 - 1);
                          local_108 = (ulong)((int)local_108 + 1);
                        } while ((int)lVar27 != (int)uVar41);
                        UVar8 = Backward(p,&local_24c,(UInt32)uVar41);
                        uVar41 = (ulong)UVar8;
                        uVar35 = (ulong)local_24c;
                        uVar39 = local_1f8;
                      }
                    }
                    else {
                      local_24c = p->matches[local_194 - 1] + 4;
                      uVar35 = (ulong)local_24c;
                      UVar11 = UVar8 - 1;
                      if (UVar11 == 0) goto LAB_00111017;
                      p->additionalOffset = p->additionalOffset + UVar11;
                      (*(p->matchFinder).Skip)(p->matchFinderObj,UVar11);
                      uVar41 = (ulong)UVar8;
                    }
                  }
                  else {
                    UVar8 = uVar37 - 1;
                    local_24c = (uint)uVar35;
                    if (UVar8 == 0) {
LAB_00111897:
                      uVar41 = 1;
                    }
                    else {
                      p->additionalOffset = p->additionalOffset + UVar8;
                      (*(p->matchFinder).Skip)(p->matchFinderObj,UVar8);
                    }
                  }
                }
              }
              else {
                UVar8 = local_228[uVar37].posPrev;
                local_24c = local_228[uVar37].backPrev;
                uVar35 = (ulong)local_24c;
                p->optimumCurrentIndex = UVar8;
                uVar41 = (ulong)(UVar8 - uVar37);
              }
            }
            else {
              if (p->additionalOffset == 0) {
                UVar8 = ReadMatchDistances(p,local_1b8);
              }
              else {
                UVar8 = p->longestMatchLength;
                local_1b8[0] = p->numPairs;
              }
              uVar37 = p->numAvail;
              if (uVar37 < 2) goto LAB_00110e07;
              uVar9 = 0x111;
              if (uVar37 < 0x111) {
                uVar9 = uVar37;
              }
              pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
              uVar39 = local_1f8;
              if (uVar9 < 4) {
                uVar9 = 3;
              }
              uVar35 = 0;
              uVar41 = 0;
              uVar40 = 0;
              do {
                if ((pBVar13[-1] == pBVar13[-2 - (ulong)local_170[uVar35]]) &&
                   (lVar27 = -(ulong)local_170[uVar35], *pBVar13 == pBVar13[lVar27 + -1])) {
                  uVar25 = 2;
                  if (uVar37 != 2) {
                    uVar22 = 2;
                    do {
                      uVar25 = uVar22;
                      if (pBVar13[uVar22 - 1] != pBVar13[uVar22 + lVar27 + -2]) break;
                      uVar22 = uVar22 + 1;
                      uVar25 = (ulong)uVar9;
                    } while (uVar9 != uVar22);
                  }
                  UVar11 = (UInt32)uVar25;
                  uVar36 = (uint)uVar35;
                  if (p->numFastBytes <= UVar11) goto LAB_00111270;
                  if (uVar40 < UVar11) {
                    uVar41 = uVar35 & 0xffffffff;
                    uVar40 = UVar11;
                  }
                }
                uVar35 = uVar35 + 1;
              } while (uVar35 != 4);
              UVar11 = UVar8;
              if (UVar8 < p->numFastBytes) {
                uVar35 = 0;
                if (1 < UVar8) {
                  uVar25 = (ulong)local_1b8[0];
                  uVar35 = (ulong)p->matches[local_1b8[0] - 1];
                  if (2 < uVar25) {
                    pUVar17 = local_a0 + uVar25;
                    uVar22 = uVar25 + 0xfffffffc;
                    do {
                      UVar11 = p->matches[uVar22 & 0xffffffff];
                      if ((UVar8 != UVar11 + 1) || (uVar9 = *pUVar17, (uint)(uVar35 >> 7) <= uVar9))
                      break;
                      uVar36 = (int)uVar25 - 2;
                      uVar25 = (ulong)uVar36;
                      pUVar17 = pUVar17 + -2;
                      uVar22 = uVar22 - 2;
                      uVar35 = (ulong)uVar9;
                      UVar8 = UVar11;
                    } while (2 < uVar36);
                  }
                  UVar10 = UVar8;
                  if (0x7f < (uint)uVar35) {
                    UVar10 = 1;
                  }
                  UVar11 = UVar8;
                  if (UVar8 == 2) {
                    UVar11 = UVar10;
                  }
                }
                uVar9 = (uint)uVar35;
                if ((uVar40 < 2) ||
                   (((uVar40 + 1 < UVar11 && ((uVar40 + 2 < UVar11 || (uVar9 < 0x200)))) &&
                    ((uVar40 + 3 < UVar11 || (uVar9 < 0x8000)))))) {
                  if ((uVar37 != 2) && (1 < UVar11)) {
                    UVar8 = ReadMatchDistances(p,local_98);
                    p->longestMatchLength = UVar8;
                    if (UVar8 < 2) {
LAB_001111d4:
                      pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                      lVar27 = 0;
                      do {
                        if ((pBVar13[-1] == pBVar13[-2 - (ulong)local_170[lVar27]]) &&
                           (lVar29 = -(ulong)local_170[lVar27], *pBVar13 == pBVar13[lVar29 + -1])) {
                          if (UVar11 - 1 < 3) goto LAB_00110e07;
                          lVar32 = 0;
                          while (pBVar13[lVar32 + 1] == pBVar13[lVar32 + lVar29]) {
                            lVar32 = lVar32 + 1;
                            if ((ulong)(UVar11 - 1) - 2 == lVar32) goto LAB_00110e07;
                          }
                        }
                        lVar27 = lVar27 + 1;
                      } while (lVar27 != 4);
                      local_24c = uVar9 + 4;
                      uVar35 = (ulong)local_24c;
                      UVar8 = UVar11 - 2;
                      if (UVar8 == 0) {
                        uVar41 = 2;
                        goto LAB_0011128f;
                      }
                      goto LAB_00111278;
                    }
                    uVar37 = p->matches[p->numPairs - 1];
                    if ((UVar8 < UVar11) || (uVar9 <= uVar37)) {
                      if (((UVar8 <= UVar11 + 1) && (UVar8 != UVar11 + 1 || uVar9 < uVar37 >> 7)) &&
                         (((UVar11 < 3 || (UVar8 + 1 < UVar11)) || ((uint)(uVar35 >> 7) <= uVar37)))
                         ) goto LAB_001111d4;
                    }
                  }
LAB_00110e07:
                  uVar41 = 1;
                  uVar35 = 0xffffffff;
                  goto LAB_0011128f;
                }
                UVar8 = uVar40 - 1;
                UVar11 = uVar40;
                local_24c = (uint)uVar41;
              }
              else {
                uVar36 = p->matches[local_1b8[0] - 1] + 4;
                uVar35 = (ulong)uVar36;
LAB_00111270:
                UVar8 = UVar11 - 1;
                uVar41 = 1;
                local_24c = uVar36;
                if (UVar8 == 0) goto LAB_0011128f;
              }
LAB_00111278:
              UVar10 = local_24c;
              p->additionalOffset = p->additionalOffset + UVar8;
              (*(p->matchFinder).Skip)(p->matchFinderObj,UVar8);
              uVar35 = (ulong)UVar10;
              uVar41 = (ulong)UVar11;
            }
LAB_0011128f:
            pCVar6 = local_1d0;
            uVar37 = (uint)uVar39;
            uVar40 = p->pbMask & uVar37;
            iVar26 = (int)uVar41;
            uVar9 = (uint)uVar35;
            if ((iVar26 == 1) && (uVar9 == 0xffffffff)) {
              local_240 = uVar41;
              RangeEnc_EncodeBit(local_1d0,local_1c0[p->state] + uVar40,0);
              pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
              pCVar6 = local_1d0;
              bVar1 = (byte)p->lc;
              iVar26 = (uint)(pBVar13[-1 - (ulong)p->additionalOffset] >> (8 - bVar1 & 0x1f)) +
                       ((p->lpMask & uVar37) << (bVar1 & 0x1f));
              pUVar5 = p->litProbs;
              uVar37 = (uint)pBVar13[-(ulong)p->additionalOffset];
              if (p->state < 7) {
                uVar37 = uVar37 | 0x100;
                do {
                  RangeEnc_EncodeBit(pCVar6,(UInt16 *)
                                            ((long)pUVar5 +
                                            (ulong)(uVar37 >> 7 & 0x1fffffe) +
                                            (ulong)(uint)(iVar26 * 0x300) * 2),uVar37 >> 7 & 1);
                  bVar42 = uVar37 < 0x8000;
                  uVar37 = uVar37 * 2;
                } while (bVar42);
              }
              else {
                uVar9 = (uint)(pBVar13 + -(ulong)p->additionalOffset)[~(ulong)*local_170];
                uVar40 = 0x100;
                uVar37 = uVar37 | 0x100;
                do {
                  uVar9 = uVar9 * 2;
                  RangeEnc_EncodeBit(pCVar6,pUVar5 + (ulong)(uint)(iVar26 * 0x300) +
                                                     (ulong)((uVar37 >> 8) + uVar40 +
                                                            (uVar9 & uVar40)),uVar37 >> 7 & 1);
                  uVar40 = uVar40 & ~(uVar37 * 2 ^ uVar9);
                  bVar42 = uVar37 < 0x8000;
                  uVar37 = uVar37 * 2;
                } while (bVar42);
              }
              p->state = kLiteralNextStates[p->state];
              uVar37 = (uint)local_1f8;
              uVar41 = local_240;
            }
            else {
              RangeEnc_EncodeBit(local_1d0,local_1c0[p->state] + uVar40,1);
              if (uVar9 < 4) {
                RangeEnc_EncodeBit(pCVar6,local_160 + p->state,1);
                if (uVar9 == 0) {
                  RangeEnc_EncodeBit(pCVar6,local_1a8 + p->state,0);
                  RangeEnc_EncodeBit(pCVar6,local_188[p->state] + uVar40,(uint)(iVar26 != 1));
                }
                else {
                  local_230 = CONCAT44(local_230._4_4_,p->reps[uVar35 & 0xffffffff]);
                  RangeEnc_EncodeBit(pCVar6,local_1a8 + p->state,1);
                  if (uVar9 == 1) {
                    RangeEnc_EncodeBit(pCVar6,local_60 + p->state,0);
                  }
                  else {
                    RangeEnc_EncodeBit(pCVar6,local_60 + p->state,1);
                    RangeEnc_EncodeBit(pCVar6,local_80 + p->state,uVar9 - 2);
                    if (uVar9 == 3) {
                      p->reps[3] = p->reps[2];
                    }
                    p->reps[2] = p->reps[1];
                  }
                  p->reps[1] = p->reps[0];
                  p->reps[0] = (UInt32)local_230;
                }
                if (iVar26 == 1) {
                  uVar9 = p->state;
                  piVar18 = kShortRepNextStates;
                }
                else {
                  LenEnc_Encode2(local_68,local_1d0,iVar26 - 2,uVar40,(uint)(p->fastMode == 0),
                                 local_238);
                  uVar9 = p->state;
                  piVar18 = kRepNextStates;
                }
                p->state = piVar18[uVar9];
              }
              else {
                RangeEnc_EncodeBit(pCVar6,local_160 + p->state,0);
                p->state = kMatchNextStates[p->state];
                local_240 = uVar41;
                LenEnc_Encode2(local_50,pCVar6,iVar26 - 2U,uVar40,(uint)(p->fastMode == 0),local_238
                              );
                paUVar7 = local_58;
                pCVar6 = local_1d0;
                local_24c = uVar9 - 4;
                local_230 = (ulong)local_24c;
                if (local_24c < 0x80) {
                  uVar37 = (uint)p->g_FastPos[local_230];
                }
                else {
                  iVar38 = 0x12;
                  if (local_24c < 0x80000) {
                    iVar38 = 6;
                  }
                  uVar37 = (uint)p->g_FastPos[local_24c >> (sbyte)iVar38] + iVar38 * 2;
                }
                uVar9 = iVar26 - 2U;
                if (4 < (uint)local_240) {
                  uVar9 = 3;
                }
                uVar39 = 1;
                uVar40 = 5;
                do {
                  bVar42 = (uVar37 >> (uVar40 & 0x1f) & 1) != 0;
                  RangeEnc_EncodeBit(pCVar6,paUVar7[uVar9] + uVar39,(uint)bVar42);
                  pUVar5 = local_90;
                  p_00 = local_1d0;
                  uVar39 = (ulong)((uint)bVar42 + (int)uVar39 * 2);
                  bVar42 = uVar40 != 0;
                  uVar40 = uVar40 - 1;
                } while (bVar42);
                if (3 < uVar37) {
                  iVar26 = (uVar37 >> 1) - 1;
                  uVar9 = (uVar37 & 1 | 2) << ((byte)iVar26 & 0x1f);
                  uVar40 = (int)local_230 - uVar9;
                  uVar39 = (ulong)uVar40;
                  if (uVar37 < 0xe) {
                    uVar40 = 1;
                    do {
                      uVar36 = (uint)uVar39 & 1;
                      RangeEnc_EncodeBit(p_00,(UInt16 *)
                                              ((long)pUVar5 +
                                              (ulong)uVar40 * 2 +
                                              ((ulong)uVar9 * 2 - (ulong)(uVar37 * 2)) + -2),uVar36)
                      ;
                      uVar40 = uVar36 + uVar40 * 2;
                      uVar39 = uVar39 >> 1;
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  else {
                    RangeEnc_EncodeDirectBits(local_1d0,uVar40 >> 4,(uVar37 >> 1) - 5);
                    pUVar5 = local_88;
                    uVar39 = (ulong)(uVar40 & 0xf);
                    uVar37 = 1;
                    iVar26 = 4;
                    do {
                      uVar9 = (uint)uVar39 & 1;
                      RangeEnc_EncodeBit(p_00,pUVar5 + uVar37,uVar9);
                      uVar37 = uVar9 + uVar37 * 2;
                      uVar39 = uVar39 >> 1;
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                    p->alignPriceCount = p->alignPriceCount + 1;
                  }
                }
                p->reps[3] = p->reps[2];
                *(undefined8 *)(p->reps + 1) = *(undefined8 *)p->reps;
                p->reps[0] = (UInt32)local_230;
                p->matchPriceCount = p->matchPriceCount + 1;
                uVar37 = (uint)local_1f8;
                uVar41 = local_240;
              }
            }
            uVar37 = uVar37 + (int)uVar41;
            uVar39 = (ulong)uVar37;
            pUVar17 = &p->additionalOffset;
            *pUVar17 = *pUVar17 - (int)uVar41;
          } while (*pUVar17 != 0);
          if (p->fastMode == 0) {
            if (0x7f < p->matchPriceCount) {
              FillDistancesPrices(p);
            }
            if (0xf < p->alignPriceCount) {
              FillAlignPrices(p);
            }
          }
          UVar8 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
          if (UVar8 == 0) break;
          uVar37 = uVar37 - (int)local_100;
          if (local_dc == 0) {
            if (0x1ffff < uVar37) {
              p->nowPos64 = p->nowPos64 + (ulong)uVar37;
              if (p->result != 0) {
                return p->result;
              }
              if ((p->rc).res != 0) goto LAB_00110abf;
              if ((p->matchFinderBase).result == 0) {
                return 0;
              }
              goto LAB_00110ae8;
            }
          }
          else if ((local_e0 <= uVar37 + 0x112c) ||
                  (local_48 <=
                   (p->rc).buf +
                   (p->rc).cacheSize + ((p->rc).processed - (long)(p->rc).bufBase) + 0x2000)) break;
        } while( true );
      }
      UVar8 = (UInt32)uVar39;
      p->nowPos64 = p->nowPos64 + (ulong)(UVar8 - (int)local_100);
LAB_00113481:
      SVar12 = Flush(p,UVar8);
      return SVar12;
    }
  }
  else {
LAB_00110abf:
    p->result = 9;
    if ((p->matchFinderBase).result == 0) {
      iVar26 = 9;
      goto LAB_00110af9;
    }
  }
LAB_00110ae8:
  p->result = 8;
  iVar26 = 8;
LAB_00110af9:
  p->finished = 1;
  return iVar26;
}

Assistant:

static SRes LzmaEnc_CodeOneBlock(CLzmaEnc *p, Bool useLimits, UInt32 maxPackSize, UInt32 maxUnpackSize)
{
  UInt32 nowPos32, startPos32;
  if (p->needInit)
  {
    p->matchFinder.Init(p->matchFinderObj);
    p->needInit = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p));

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0)
  {
    UInt32 numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][0], 0);
    p->state = kLiteralNextStates[p->state];
    curByte = *(p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
  for (;;)
  {
    UInt32 pos, len, posState;

    if (p->fastMode)
      len = GetOptimumFast(p, &pos);
    else
      len = GetOptimum(p, nowPos32, &pos);

    #ifdef SHOW_STAT2
    printf("\n pos = %4X,   len = %u   pos = %u", nowPos32, len, pos);
    #endif

    posState = nowPos32 & p->pbMask;
    if (len == 1 && pos == (UInt32)-1)
    {
      Byte curByte;
      CLzmaProb *probs;
      const Byte *data;

      RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 0);
      data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
      curByte = *data;
      probs = LIT_PROBS(nowPos32, *(data - 1));
      if (IsCharState(p->state))
        LitEnc_Encode(&p->rc, probs, curByte);
      else
        LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0] - 1));
      p->state = kLiteralNextStates[p->state];
    }
    else
    {
      RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 1);
      if (pos < LZMA_NUM_REPS)
      {
        RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 1);
        if (pos == 0)
        {
          RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 0);
          RangeEnc_EncodeBit(&p->rc, &p->isRep0Long[p->state][posState], ((len == 1) ? 0 : 1));
        }
        else
        {
          UInt32 distance = p->reps[pos];
          RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 1);
          if (pos == 1)
            RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 0);
          else
          {
            RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 1);
            RangeEnc_EncodeBit(&p->rc, &p->isRepG2[p->state], pos - 2);
            if (pos == 3)
              p->reps[3] = p->reps[2];
            p->reps[2] = p->reps[1];
          }
          p->reps[1] = p->reps[0];
          p->reps[0] = distance;
        }
        if (len == 1)
          p->state = kShortRepNextStates[p->state];
        else
        {
          LenEnc_Encode2(&p->repLenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
          p->state = kRepNextStates[p->state];
        }
      }
      else
      {
        UInt32 posSlot;
        RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 0);
        p->state = kMatchNextStates[p->state];
        LenEnc_Encode2(&p->lenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
        pos -= LZMA_NUM_REPS;
        GetPosSlot(pos, posSlot);
        RcTree_Encode(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], kNumPosSlotBits, posSlot);
        
        if (posSlot >= kStartPosModelIndex)
        {
          UInt32 footerBits = ((posSlot >> 1) - 1);
          UInt32 base = ((2 | (posSlot & 1)) << footerBits);
          UInt32 posReduced = pos - base;

          if (posSlot < kEndPosModelIndex)
            RcTree_ReverseEncode(&p->rc, p->posEncoders + base - posSlot - 1, footerBits, posReduced);
          else
          {
            RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
            RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);
            p->alignPriceCount++;
          }
        }
        p->reps[3] = p->reps[2];
        p->reps[2] = p->reps[1];
        p->reps[1] = p->reps[0];
        p->reps[0] = pos;
        p->matchPriceCount++;
      }
    }
    p->additionalOffset -= len;
    nowPos32 += len;
    if (p->additionalOffset == 0)
    {
      UInt32 processed;
      if (!p->fastMode)
      {
        if (p->matchPriceCount >= (1 << 7))
          FillDistancesPrices(p);
        if (p->alignPriceCount >= kAlignTableSize)
          FillAlignPrices(p);
      }
      if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
        break;
      processed = nowPos32 - startPos32;
      if (useLimits)
      {
        if (processed + kNumOpts + 300 >= maxUnpackSize ||
            RangeEnc_GetProcessed(&p->rc) + kNumOpts * 2 >= maxPackSize)
          break;
      }
      else if (processed >= (1 << 17))
      {
        p->nowPos64 += nowPos32 - startPos32;
        return CheckErrors(p);
      }
    }
  }
  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}